

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O1

int delta_encode_cost(int *colors,int num,int bit_depth,int min_val)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  int aiStack_28 [2];
  int deltas [8];
  
  if (num < 1) {
    return 0;
  }
  if (num == 1) {
    return bit_depth;
  }
  iVar2 = bit_depth + 2;
  lVar7 = 0;
  iVar6 = 0;
  do {
    iVar8 = colors[lVar7 + 1] - colors[lVar7];
    aiStack_28[lVar7] = iVar8;
    if (iVar8 <= iVar6) {
      iVar8 = iVar6;
    }
    iVar6 = iVar8;
    lVar7 = lVar7 + 1;
  } while ((ulong)(uint)num - 1 != lVar7);
  uVar9 = iVar6 - min_val;
  iVar6 = (1 << ((byte)bit_depth & 0x1f)) - (min_val + *colors);
  uVar1 = 0x1f;
  if (uVar9 != 0) {
    for (; uVar9 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  iVar8 = (uVar1 ^ 0xffffffe0) + 0x21;
  if ((int)(uVar9 + 1) < 2) {
    iVar8 = 0;
  }
  if (iVar8 <= bit_depth + -3) {
    iVar8 = bit_depth + -3;
  }
  iVar4 = 2;
  if (2 < num) {
    iVar4 = num;
  }
  uVar3 = 0;
  do {
    iVar2 = iVar2 + iVar8;
    iVar6 = iVar6 - aiStack_28[uVar3];
    uVar1 = 0x1f;
    if (iVar6 - 1U != 0) {
      for (; iVar6 - 1U >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    iVar5 = (uVar1 ^ 0xffffffe0) + 0x21;
    if (iVar6 < 2) {
      iVar5 = 0;
    }
    if (iVar5 <= iVar8) {
      iVar8 = iVar5;
    }
    uVar3 = uVar3 + 1;
  } while (iVar4 - 1 != uVar3);
  return iVar2;
}

Assistant:

static int delta_encode_cost(const int *colors, int num, int bit_depth,
                             int min_val) {
  if (num <= 0) return 0;
  int bits_cost = bit_depth;
  if (num == 1) return bits_cost;
  bits_cost += 2;
  int max_delta = 0;
  int deltas[PALETTE_MAX_SIZE];
  const int min_bits = bit_depth - 3;
  for (int i = 1; i < num; ++i) {
    const int delta = colors[i] - colors[i - 1];
    deltas[i - 1] = delta;
    assert(delta >= min_val);
    if (delta > max_delta) max_delta = delta;
  }
  int bits_per_delta = AOMMAX(av1_ceil_log2(max_delta + 1 - min_val), min_bits);
  assert(bits_per_delta <= bit_depth);
  int range = (1 << bit_depth) - colors[0] - min_val;
  for (int i = 0; i < num - 1; ++i) {
    bits_cost += bits_per_delta;
    range -= deltas[i];
    bits_per_delta = AOMMIN(bits_per_delta, av1_ceil_log2(range));
  }
  return bits_cost;
}